

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void gai_oper_elem(Integer g_a,Integer *lo,Integer *hi,void *scalar,Integer op)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  int iVar5;
  Integer IVar6;
  int iVar7;
  logical lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  bool bVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  char *data_ptr;
  Integer ndim;
  Integer type;
  Integer loA [7];
  Integer hiA [7];
  Integer ld [7];
  Integer bunit [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_5a8;
  char *local_5a0;
  double *local_598;
  long local_590;
  int local_584;
  long local_580;
  undefined1 local_578 [16];
  Integer *local_560;
  Integer *local_558;
  long local_550;
  Integer local_548;
  long local_540;
  long local_538;
  Integer local_530;
  Integer local_528;
  long local_520 [6];
  long lStack_4f0;
  int local_4e8 [2];
  long local_4e0 [7];
  long local_4a8 [8];
  undefined8 local_468;
  long lStack_460;
  undefined1 local_458 [48];
  long local_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_598 = (double *)scalar;
  local_560 = lo;
  local_558 = hi;
  local_548 = op;
  pnga_nodeid();
  bVar20 = _ga_sync_begin != 0;
  local_584 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar20) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"gai_oper_elem");
  pnga_inquire(g_a,&local_580,&local_590,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar7 = pnga_local_iterator_next(&local_330,&local_528,(Integer *)local_4e8,&local_5a8,local_4a8);
  do {
    if (iVar7 == 0) {
      if (local_584 != 0) {
        pnga_sync();
      }
      return;
    }
    pnga_nnodes();
    lVar12 = local_590;
    if (0 < local_590) {
      memcpy(alStack_3b0 + 1,&local_528,local_590 * 8);
    }
    lVar8 = pnga_patch_intersect(local_560,local_558,&local_528,(Integer *)local_4e8,lVar12);
    if (lVar8 != 0) {
      if (0 < local_590) {
        lVar12 = 0;
LAB_0011886b:
        if (local_520[lVar12 + -1] <= alStack_3b0[lVar12 + 1]) break;
        if (local_590 == 1) {
          lVar12 = 1;
          lVar17 = 0;
        }
        else {
          lVar12 = 1;
          lVar17 = 0;
          lVar19 = 0;
          do {
            lVar17 = lVar17 + (local_520[lVar19 + -1] - alStack_3b0[lVar19 + 1]) * lVar12;
            lVar12 = lVar12 * local_4a8[lVar19];
            lVar19 = lVar19 + 1;
          } while (local_590 + -1 != lVar19);
        }
        if (local_580 - 0x3e9U < 7) {
          lVar17 = ((&local_530)[local_590] - alStack_3b0[local_590]) * lVar12 + lVar17;
          switch(local_580) {
          case 0x3e9:
          case 0x3eb:
            lVar17 = lVar17 * 4;
            break;
          default:
            lVar17 = lVar17 * 8;
            break;
          case 0x3ed:
            goto switchD_00118906_caseD_3ed;
          case 0x3ef:
            lVar17 = lVar17 * 0x10;
          }
          local_5a8 = local_5a8 + lVar17;
        }
        else {
switchD_00118906_caseD_3ed:
          pnga_error(" wrong data type ",local_580);
        }
      }
LAB_0011891c:
      lVar17 = local_580;
      lVar12 = local_590;
      local_5a0 = local_5a8;
      lVar19 = 1;
      if (1 < local_590) {
        lVar9 = 1;
        do {
          lVar19 = lVar19 * ((local_4e0[lVar9 + -1] - local_520[lVar9 + -1]) + 1);
          lVar9 = lVar9 + 1;
        } while (local_590 != lVar9);
      }
      local_468 = 0;
      lStack_460 = 0;
      local_3e8[0] = 1;
      local_3e8[1] = 1;
      local_428[0] = local_4a8[0];
      local_428[1] = local_4a8[0] * local_4a8[1];
      if (2 < local_590) {
        memset(local_458,0,local_590 * 8 - 0x10);
        lVar13 = 2;
        lVar9 = local_428[1];
        lVar16 = local_3e8[1];
        do {
          lVar16 = lVar16 * (((&lStack_4f0)[lVar13] - (&local_530)[lVar13]) + 1);
          lVar9 = lVar9 * local_4a8[lVar13];
          local_3e8[lVar13] = lVar16;
          local_428[lVar13] = lVar9;
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
      }
      if (0 < lVar19) {
        local_550 = (long)(int)lVar17;
        pauVar18 = (undefined1 (*) [16])0x0;
        lVar9 = 0;
        local_530 = lVar17;
        local_538 = lVar12;
        local_540 = lVar19;
        do {
          IVar6 = local_530;
          if (local_538 < 2) {
            lVar17 = 0;
          }
          else {
            lVar19 = 0;
            lVar17 = 0;
            do {
              lVar16 = *(long *)(local_458 + lVar19 * 8 + -8);
              if ((lVar9 + 1) % local_3e8[lVar19 + 1] == 0) {
                *(long *)(local_458 + lVar19 * 8 + -8) = lVar16 + 1;
              }
              lVar17 = lVar17 + lVar16 * local_428[lVar19];
              lVar16 = 0;
              if (*(long *)(local_458 + lVar19 * 8 + -8) <= local_4e0[lVar19] - local_520[lVar19]) {
                lVar16 = *(long *)(local_458 + lVar19 * 8 + -8);
              }
              *(long *)(local_458 + lVar19 * 8 + -8) = lVar16;
              lVar19 = lVar19 + 1;
            } while (lVar12 + -1 != lVar19);
          }
          switch(local_530) {
          case 0x3e9:
          case 0x3eb:
            pauVar18 = (undefined1 (*) [16])(local_5a0 + lVar17 * 4);
            break;
          case 0x3ea:
          case 0x3ec:
          case 0x3ee:
            pauVar18 = (undefined1 (*) [16])(local_5a0 + lVar17 * 8);
            break;
          default:
            pnga_error("wrong data type.",local_530);
            break;
          case 0x3ef:
            pauVar18 = (undefined1 (*) [16])(local_5a0 + lVar17 * 0x10);
          }
          uVar11 = local_4e8[0] - (int)local_528;
          uVar21 = uVar11 + 1;
          uVar10 = (ulong)uVar21;
          uVar4 = (undefined4)IVar6;
          if (local_548 == 2) {
            switch(uVar4) {
            case 0x3e9:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  iVar7 = *(int *)(*pauVar18 + uVar15 * 4);
                  if (iVar7 == 0) {
                    pnga_error("zero value at index",uVar15);
                  }
                  else {
                    if (2 < iVar7 + 1U) {
                      iVar7 = 0;
                    }
                    *(int *)(*pauVar18 + uVar15 * 4) = iVar7;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ea:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  lVar17 = *(long *)(*pauVar18 + uVar15 * 8);
                  if (lVar17 == 0) {
                    pnga_error("zero value at index",uVar15);
                  }
                  else {
                    if (2 < lVar17 + 1U) {
                      lVar17 = 0;
                    }
                    *(long *)(*pauVar18 + uVar15 * 8) = lVar17;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3eb:
              if (uVar11 < 0x7fffffff) {
                uVar10 = 0;
                do {
                  fVar24 = *(float *)(*pauVar18 + uVar10 * 4);
                  if ((fVar24 != 0.0) || (NAN(fVar24))) {
                    *(float *)(*pauVar18 + uVar10 * 4) = 1.0 / fVar24;
                  }
                  else {
                    pnga_error("zero value at index",uVar10);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar21 != uVar10);
              }
              break;
            case 0x3ec:
              if (uVar11 < 0x7fffffff) {
                uVar10 = 0;
                do {
                  dVar3 = *(double *)(*pauVar18 + uVar10 * 8);
                  if ((dVar3 != 0.0) || (NAN(dVar3))) {
                    *(double *)(*pauVar18 + uVar10 * 8) = 1.0 / dVar3;
                  }
                  else {
                    pnga_error("zero value at index",uVar10);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar21 != uVar10);
              }
              break;
            default:
              goto switchD_00118b5b_caseD_3ed;
            case 0x3ee:
              if (uVar11 < 0x7fffffff) {
                uVar10 = 0;
                do {
                  fVar24 = (float)*(undefined8 *)(*pauVar18 + uVar10 * 8);
                  fVar25 = (float)((ulong)*(undefined8 *)(*pauVar18 + uVar10 * 8) >> 0x20);
                  uVar11 = -(uint)(-fVar24 <= fVar24);
                  uVar22 = -(uint)(-fVar25 <= fVar25);
                  uVar15 = CONCAT44(~uVar22 & (uint)-fVar25,~uVar11 & (uint)-fVar24) |
                           CONCAT44((uint)fVar25 & uVar22,(uint)fVar24 & uVar11);
                  if ((float)(uVar15 >> 0x20) <= (float)uVar15) {
                    if ((fVar24 != 0.0) || (NAN(fVar24))) {
                      fVar25 = fVar25 / fVar24;
                      fVar26 = 1.0 / ((fVar25 * fVar25 + 1.0) * fVar24);
                      *(float *)(*pauVar18 + uVar10 * 8) = fVar26;
                      fVar26 = -fVar25 * fVar26;
                      goto LAB_0011916a;
                    }
                    pnga_error("zero value at index",uVar10);
                  }
                  else {
                    fVar24 = fVar24 / fVar25;
                    fVar26 = 1.0 / ((fVar24 * fVar24 + 1.0) * fVar25);
                    *(float *)(*pauVar18 + uVar10 * 8) = fVar24 * fVar26;
                    fVar26 = -fVar26;
LAB_0011916a:
                    *(float *)(*pauVar18 + uVar10 * 8 + 4) = fVar26;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar21 != uVar10);
              }
              break;
            case 0x3ef:
              if (uVar11 < 0x7fffffff) {
                uVar10 = 0;
                pauVar14 = pauVar18;
                do {
                  dVar3 = *(double *)*pauVar14;
                  dVar2 = *(double *)(*pauVar14 + 8);
                  uVar15 = -(ulong)(-dVar3 <= dVar3);
                  uVar23 = -(ulong)(-dVar2 <= dVar2);
                  auVar30._0_8_ = (ulong)dVar3 & uVar15;
                  auVar30._8_8_ = (ulong)dVar2 & uVar23;
                  auVar27._0_8_ = ~uVar15 & (ulong)-dVar3;
                  auVar27._8_8_ = ~uVar23 & (ulong)-dVar2;
                  if (SUB168(auVar27 | auVar30,8) <= SUB168(auVar27 | auVar30,0)) {
                    if ((dVar3 != 0.0) || (NAN(dVar3))) {
                      dVar2 = dVar2 / dVar3;
                      dVar3 = 1.0 / ((dVar2 * dVar2 + 1.0) * dVar3);
                      *(double *)*pauVar14 = dVar3;
                      *(double *)(*pauVar14 + 8) = -dVar2 * dVar3;
                    }
                    else {
                      pnga_error("zero value at index",uVar10);
                    }
                  }
                  else {
                    dVar3 = dVar3 / dVar2;
                    dVar2 = 1.0 / ((dVar3 * dVar3 + 1.0) * dVar2);
                    *(double *)*pauVar14 = dVar3 * dVar2;
                    *(double *)(*pauVar14 + 8) = -dVar2;
                  }
                  uVar10 = uVar10 + 1;
                  pauVar14 = pauVar14 + 1;
                } while (uVar21 != uVar10);
              }
            }
          }
          else if (local_548 == 1) {
            switch(uVar4) {
            case 0x3e9:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  *(int *)(*pauVar18 + uVar15 * 4) =
                       *(int *)(*pauVar18 + uVar15 * 4) + (int)*(float *)local_598;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ea:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  *(long *)(*pauVar18 + uVar15 * 8) =
                       *(long *)(*pauVar18 + uVar15 * 8) + (long)*local_598;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3eb:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  *(float *)(*pauVar18 + uVar15 * 4) =
                       *(float *)local_598 + *(float *)(*pauVar18 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ec:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  *(double *)(*pauVar18 + uVar15 * 8) =
                       *local_598 + *(double *)(*pauVar18 + uVar15 * 8);
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            default:
switchD_00118b5b_caseD_3ed:
              pnga_error("wrong data type",local_550);
              break;
            case 0x3ee:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  *(ulong *)(*pauVar18 + uVar15 * 8) =
                       CONCAT44((float)((ulong)*(undefined8 *)(*pauVar18 + uVar15 * 8) >> 0x20) +
                                (float)((ulong)*local_598 >> 0x20),
                                (float)*(undefined8 *)(*pauVar18 + uVar15 * 8) + SUB84(*local_598,0)
                               );
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ef:
              pauVar14 = pauVar18;
              if (uVar11 < 0x7fffffff) {
                do {
                  dVar3 = *(double *)(*pauVar14 + 8) + local_598[1];
                  auVar1._8_4_ = SUB84(dVar3,0);
                  auVar1._0_8_ = *(double *)*pauVar14 + *local_598;
                  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
                  *pauVar14 = auVar1;
                  uVar10 = uVar10 - 1;
                  pauVar14 = pauVar14 + 1;
                } while (uVar10 != 0);
              }
            }
          }
          else {
            switch(uVar4) {
            case 0x3e9:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  iVar7 = *(int *)(*pauVar18 + uVar15 * 4);
                  iVar5 = -iVar7;
                  if (0 < iVar7) {
                    iVar5 = iVar7;
                  }
                  *(int *)(*pauVar18 + uVar15 * 4) = iVar5;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ea:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  lVar17 = *(long *)(*pauVar18 + uVar15 * 8);
                  lVar19 = -lVar17;
                  if (0 < lVar17) {
                    lVar19 = lVar17;
                  }
                  *(long *)(*pauVar18 + uVar15 * 8) = lVar19;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3eb:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  fVar24 = *(float *)(*pauVar18 + uVar15 * 4);
                  uVar21 = -(uint)(fVar24 < -fVar24);
                  *(uint *)(*pauVar18 + uVar15 * 4) =
                       ~uVar21 & (uint)fVar24 | (uint)-fVar24 & uVar21;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ec:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  dVar3 = *(double *)(*pauVar18 + uVar15 * 8);
                  uVar23 = -(ulong)(dVar3 < -dVar3);
                  *(ulong *)(*pauVar18 + uVar15 * 8) =
                       ~uVar23 & (ulong)dVar3 | (ulong)-dVar3 & uVar23;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            default:
              goto switchD_00118b5b_caseD_3ed;
            case 0x3ee:
              if (uVar11 < 0x7fffffff) {
                uVar15 = 0;
                do {
                  fVar24 = (float)*(undefined8 *)(*pauVar18 + uVar15 * 8);
                  fVar25 = (float)((ulong)*(undefined8 *)(*pauVar18 + uVar15 * 8) >> 0x20);
                  uVar21 = -(uint)(-fVar24 <= fVar24);
                  uVar11 = -(uint)(-fVar25 <= fVar25);
                  uVar23 = CONCAT44(~uVar11 & (uint)-fVar25,~uVar21 & (uint)-fVar24) |
                           CONCAT44((uint)fVar25 & uVar11,(uint)fVar24 & uVar21);
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = uVar23;
                  auVar34._4_4_ = (float)(uVar23 >> 0x20);
                  if (auVar34._4_4_ <= (float)uVar23) {
                    fVar26 = 0.0;
                    if ((fVar24 != 0.0) || (NAN(fVar24))) {
                      fVar24 = (fVar25 / fVar24) * (fVar25 / fVar24);
                      goto LAB_00119295;
                    }
                  }
                  else {
                    fVar24 = (fVar24 / fVar25) * (fVar24 / fVar25);
                    auVar34._0_4_ = auVar34._4_4_;
                    auVar34._8_4_ = auVar34._4_4_;
                    auVar34._12_4_ = auVar34._4_4_;
                    auVar33 = auVar34;
LAB_00119295:
                    dVar3 = (double)(fVar24 + 1.0);
                    if (dVar3 < 0.0) {
                      local_578 = auVar33;
                      dVar3 = sqrt(dVar3);
                      auVar33 = local_578;
                    }
                    else {
                      dVar3 = SQRT(dVar3);
                    }
                    fVar26 = (float)((double)auVar33._0_4_ * dVar3);
                  }
                  *(float *)(*pauVar18 + uVar15 * 8) = fVar26;
                  *(undefined4 *)(*pauVar18 + uVar15 * 8 + 4) = 0;
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            case 0x3ef:
              if (uVar11 < 0x7fffffff) {
                lVar17 = 0;
                do {
                  dVar3 = *(double *)(*pauVar18 + lVar17);
                  dVar2 = *(double *)((long)(*pauVar18 + lVar17) + 8);
                  uVar15 = -(ulong)(-dVar3 <= dVar3);
                  uVar23 = -(ulong)(-dVar2 <= dVar2);
                  auVar31._0_8_ = (ulong)dVar3 & uVar15;
                  auVar31._8_8_ = (ulong)dVar2 & uVar23;
                  auVar28._0_8_ = ~uVar15 & (ulong)-dVar3;
                  auVar28._8_8_ = ~uVar23 & (ulong)-dVar2;
                  auVar28 = auVar28 | auVar31;
                  auVar32._0_8_ = auVar28._8_8_;
                  auVar32._8_4_ = auVar28._8_4_;
                  auVar32._12_4_ = auVar28._12_4_;
                  if (auVar32._0_8_ <= auVar28._0_8_) {
                    dVar29 = 0.0;
                    if ((dVar3 != 0.0) || (NAN(dVar3))) {
                      dVar3 = (dVar2 / dVar3) * (dVar2 / dVar3);
                      goto LAB_00118fc4;
                    }
                  }
                  else {
                    dVar3 = (dVar3 / dVar2) * (dVar3 / dVar2);
                    auVar28 = auVar32;
LAB_00118fc4:
                    dVar3 = dVar3 + 1.0;
                    if (dVar3 < 0.0) {
                      local_578 = auVar28;
                      dVar3 = sqrt(dVar3);
                      dVar29 = (double)local_578._0_8_;
                    }
                    else {
                      dVar3 = SQRT(dVar3);
                      dVar29 = auVar28._0_8_;
                    }
                    dVar29 = dVar29 * dVar3;
                  }
                  *(double *)(*pauVar18 + lVar17) = dVar29;
                  *(undefined8 *)(*pauVar18 + lVar17 + 8) = 0;
                  lVar17 = lVar17 + 0x10;
                } while (uVar10 << 4 != lVar17);
              }
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != local_540);
      }
    }
    iVar7 = pnga_local_iterator_next
                      (&local_330,&local_528,(Integer *)local_4e8,&local_5a8,local_4a8);
  } while( true );
  lVar12 = lVar12 + 1;
  if (local_590 == lVar12) goto LAB_0011891c;
  goto LAB_0011886b;
}

Assistant:

static void gai_oper_elem(Integer g_a, Integer *lo, Integer *hi, void *scalar, Integer op)
{

  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer me= pnga_nodeid();
  Integer num_blocks;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle(g_a, "gai_oper_elem");


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }
    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",type);
        }
      }
      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);
    }
  }
#if 0
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */
    pnga_distribution(g_a, me, loA, hiA);

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {

        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA); 

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }
          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}